

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

DescriptorScriptReference * __thiscall
cfd::core::DescriptorScriptReference::operator=
          (DescriptorScriptReference *this,DescriptorScriptReference *object)

{
  DescriptorScriptReference *object_local;
  DescriptorScriptReference *this_local;
  
  if (this != object) {
    Script::operator=(&this->locking_script_,&object->locking_script_);
    this->script_type_ = object->script_type_;
    core::Address::operator=(&this->address_script_,&object->address_script_);
    this->is_script_ = (bool)(object->is_script_ & 1);
    Script::operator=(&this->redeem_script_,&object->redeem_script_);
    ::std::shared_ptr<cfd::core::DescriptorScriptReference>::operator=
              (&this->child_script_,&object->child_script_);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    operator=(&this->keys_,&object->keys_);
    this->req_num_ = object->req_num_;
    TapBranch::operator=(&this->tapbranch_,&object->tapbranch_);
    this->is_tapbranch_ = (bool)(object->is_tapbranch_ & 1);
    TaprootScriptTree::operator=(&this->script_tree_,&object->script_tree_);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&this->addr_prefixes_,&object->addr_prefixes_);
  }
  return this;
}

Assistant:

DescriptorScriptReference& DescriptorScriptReference::operator=(
    const DescriptorScriptReference& object) {
  if (this != &object) {
    locking_script_ = object.locking_script_;
    script_type_ = object.script_type_;
    address_script_ = object.address_script_;
    is_script_ = object.is_script_;
    redeem_script_ = object.redeem_script_;
    child_script_ = object.child_script_;
    keys_ = object.keys_;
    req_num_ = object.req_num_;
    tapbranch_ = object.tapbranch_;
    is_tapbranch_ = object.is_tapbranch_;
    script_tree_ = object.script_tree_;
    addr_prefixes_ = object.addr_prefixes_;
  }
  return *this;
}